

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

Mvc_Cover_t * Mvc_CoverCofactor(Mvc_Cover_t *p,int iValue,int iValueOther)

{
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar1;
  Mvc_List_t *pList;
  Mvc_Cube_t *pCubeCopy;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover;
  int iValueOther_local;
  int iValue_local;
  Mvc_Cover_t *p_local;
  
  pCover_00 = Mvc_CoverClone(p);
  for (pCubeCopy = (p->lCubes).pHead; pCubeCopy != (Mvc_Cube_t *)0x0; pCubeCopy = pCubeCopy->pNext)
  {
    if ((pCubeCopy->pData[iValue >> 5] & 1 << ((byte)iValue & 0x1f)) != 0) {
      pMVar1 = Mvc_CubeDup(pCover_00,pCubeCopy);
      if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
        (pCover_00->lCubes).pHead = pMVar1;
      }
      else {
        ((pCover_00->lCubes).pTail)->pNext = pMVar1;
      }
      (pCover_00->lCubes).pTail = pMVar1;
      pMVar1->pNext = (Mvc_Cube_t *)0x0;
      (pCover_00->lCubes).nItems = (pCover_00->lCubes).nItems + 1;
      pMVar1->pData[iValueOther >> 5] =
           1 << ((byte)iValueOther & 0x1f) | pMVar1->pData[iValueOther >> 5];
    }
  }
  return pCover_00;
}

Assistant:

Mvc_Cover_t * Mvc_CoverCofactor( Mvc_Cover_t * p, int iValue, int iValueOther )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube, * pCubeCopy;
    // clone the cover
    pCover = Mvc_CoverClone( p );
    // copy the cube list
    Mvc_CoverForEachCube( p, pCube )
        if ( Mvc_CubeBitValue( pCube, iValue ) )
        {
            pCubeCopy = Mvc_CubeDup( pCover, pCube );
            Mvc_CoverAddCubeTail( pCover, pCubeCopy );
            Mvc_CubeBitInsert( pCubeCopy, iValueOther );
        }
    return pCover;
}